

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

Mat * RandomMat(Mat *__return_storage_ptr__,int w,int h,int c)

{
  ulong uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint_fast16_t uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  ncnn::Mat::create(__return_storage_ptr__,w,h,c,4,(Allocator *)0x0);
  lVar5 = (long)__return_storage_ptr__->c * __return_storage_ptr__->cstep;
  if (lVar5 != 0) {
    pvVar2 = __return_storage_ptr__->data;
    lVar6 = 0;
    do {
      uVar7 = g_prng_rand_state.i;
      uVar9 = 0;
      do {
        iVar3 = (int)uVar7;
        iVar4 = (int)uVar9;
        uVar8 = g_prng_rand_state.s[iVar3 + iVar4 + 9U & 0x3f] +
                g_prng_rand_state.s[iVar3 + iVar4 + 0x28U & 0x3f];
        uVar1 = uVar9 + 1;
        g_prng_rand_state.s[iVar3 + iVar4 & 0x3f] = uVar8;
        if (g_prng_rand_state.c != 0) break;
        bVar10 = uVar9 < 0x1ef;
        uVar9 = uVar1;
      } while (bVar10);
      bVar10 = g_prng_rand_state.c == 0;
      g_prng_rand_state.c = g_prng_rand_state.c - 1;
      if (bVar10) {
        g_prng_rand_state.c = 0x36;
      }
      *(float *)((long)pvVar2 + lVar6 * 4) = (float)uVar8 * 5.421011e-20 * 4.0 + -2.0;
      lVar6 = lVar6 + 1;
      g_prng_rand_state.i = uVar7 + uVar1;
    } while (lVar6 != lVar5);
    g_prng_rand_state.i = uVar7 + uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static ncnn::Mat RandomMat(int w, int h, int c)
{
    ncnn::Mat m(w, h, c);
    Randomize(m);
    return m;
}